

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O0

char * kwsysSystem_Shell__SkipMakeVariables(char *c)

{
  int iVar1;
  bool bVar2;
  char *local_18;
  char *skip;
  char *c_local;
  
  skip = c;
  while( true ) {
    bVar2 = false;
    if (*skip == '$') {
      bVar2 = skip[1] == '(';
    }
    if (!bVar2) {
      return skip;
    }
    local_18 = skip + 2;
    while (iVar1 = kwsysSystem_Shell__CharIsMakeVariableName(*local_18), iVar1 != 0) {
      local_18 = local_18 + 1;
    }
    if (*local_18 != ')') break;
    skip = local_18 + 1;
  }
  return skip;
}

Assistant:

static const char* kwsysSystem_Shell__SkipMakeVariables(const char* c)
{
  while(*c == '$' && *(c+1) == '(')
    {
    const char* skip = c+2;
    while(kwsysSystem_Shell__CharIsMakeVariableName(*skip))
      {
      ++skip;
      }
    if(*skip == ')')
      {
      c = skip+1;
      }
    else
      {
      break;
      }
    }
  return c;
}